

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringList.h
# Opt level: O3

vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> * __thiscall
llbuild::basic::StringList::getValues
          (vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *__return_storage_ptr__,
          StringList *this)

{
  pointer *ppSVar1;
  iterator __position;
  ulong uVar2;
  uint64_t uVar3;
  StringRef value;
  StringRef local_38;
  
  (__return_storage_ptr__->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = this->size;
  if (uVar3 != 0) {
    uVar2 = 0;
    do {
      local_38.Data = this->contents + uVar2;
      if (this->contents == (char *)0x0) {
        local_38.Length = 0;
      }
      else {
        local_38.Length = strlen(local_38.Data);
      }
      if (uVar3 < local_38.Length + uVar2) {
        __assert_fail("i + value.size() <= size",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/Basic/StringList.h"
                      ,0x5d,"std::vector<StringRef> llbuild::basic::StringList::getValues() const");
      }
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>::
        _M_realloc_insert<llvm::StringRef_const&>
                  ((vector<llvm::StringRef,std::allocator<llvm::StringRef>> *)__return_storage_ptr__
                   ,__position,&local_38);
      }
      else {
        (__position._M_current)->Data = local_38.Data;
        (__position._M_current)->Length = local_38.Length;
        ppSVar1 = &(__return_storage_ptr__->
                   super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      uVar2 = uVar2 + local_38.Length + 1;
      uVar3 = this->size;
    } while (uVar2 < uVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<StringRef> getValues() const {
    std::vector<StringRef> result;
    for (uint64_t i = 0; i < size;) {
      auto value = StringRef(&contents[i]);
      assert(i + value.size() <= size);
      result.push_back(value);
      i += value.size() + 1;
    }
    return result;
  }